

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparspak.cpp
# Opt level: O2

void sp_solve(int neqns,int *xlnz,double *lnz,int *xnzsub,int *nzsub,double *diag,double *rhs)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  int *piVar8;
  double dVar9;
  
  iVar3 = 0;
  if (0 < neqns) {
    iVar3 = neqns;
  }
  uVar7 = 1;
  while (uVar7 != iVar3 + 1U) {
    dVar9 = rhs[uVar7 - 1];
    dVar1 = diag[uVar7 - 1];
    rhs[uVar7 - 1] = dVar9 / dVar1;
    lVar4 = uVar7 - 1;
    lVar5 = uVar7 - 1;
    iVar2 = xlnz[uVar7];
    uVar7 = uVar7 + 1;
    piVar8 = nzsub + (long)xnzsub[lVar4] + -1;
    for (lVar4 = (long)xlnz[lVar5]; lVar4 < iVar2; lVar4 = lVar4 + 1) {
      rhs[(long)*piVar8 + -1] = rhs[(long)*piVar8 + -1] - lnz[lVar4 + -1] * (dVar9 / dVar1);
      piVar8 = piVar8 + 1;
    }
  }
  lVar4 = (long)neqns;
  for (uVar6 = 1; uVar6 != iVar3 + 1U; uVar6 = uVar6 + 1) {
    dVar9 = rhs[lVar4 + -1];
    piVar8 = nzsub + (long)xnzsub[lVar4 + -1] + -1;
    for (lVar5 = (long)xlnz[lVar4 + -1]; lVar5 < xlnz[lVar4]; lVar5 = lVar5 + 1) {
      dVar9 = dVar9 - lnz[lVar5 + -1] * rhs[(long)*piVar8 + -1];
      piVar8 = piVar8 + 1;
    }
    rhs[lVar4 + -1] = dVar9 / diag[lVar4 + -1];
    lVar4 = lVar4 + -1;
  }
  return;
}

Assistant:

void sp_solve(int neqns, int* xlnz, double* lnz, int* xnzsub,
           int* nzsub, double* diag, double* rhs)
{
    int i, isub;
    double rhsj, s;

    /* Adjust from C to Fortran */

    --xlnz; --lnz; --xnzsub; --nzsub; --diag; --rhs;

    /* Forward substitution */

    for (int j = 1; j <= neqns; j++)
    {
        rhsj = rhs[j] / diag[j];
        rhs[j] = rhsj;
        i = xnzsub[j];
        for (int ii = xlnz[j]; ii < xlnz[j+1]; ii++)
        {
            isub = nzsub[i];
            rhs[isub] -= lnz[ii] * rhsj;
            i += 1;
        }
    }

    /* Backward substitution */

    int j = neqns;
    for (int jj = 1; jj <= neqns; jj++)
    {
        s = rhs[j];
        i = xnzsub[j];
        for (int ii = xlnz[j]; ii < xlnz[j+1]; ii++)
        {
            isub = nzsub[i];
            s -= lnz[ii] * rhs[isub];
            i += 1;
        }
        rhs[j] = s / diag[j];
        j -= 1;
    }

    /* Adjust from Fortran to C */

    ++xlnz; ++lnz; ++xnzsub; ++nzsub; ++diag; ++rhs;

}